

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_raw.c
# Opt level: O1

ssize_t archive_write_raw_data(archive_write *a,void *buff,size_t s)

{
  int iVar1;
  
  iVar1 = __archive_write_output(a,buff,s);
  if (iVar1 < 0) {
    s = (long)iVar1;
  }
  return s;
}

Assistant:

static ssize_t
archive_write_raw_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;

	ret = __archive_write_output(a, buff, s);
	if (ret >= 0)
		return (s);
	else
		return (ret);
}